

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_cmd_send(void *ctx)

{
  byte *pbVar1;
  RK_U32 *pRVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  RK_S32 RVar6;
  MPP_RET MVar7;
  uint uVar8;
  MppReqV1 *pMVar9;
  long lVar10;
  MPP_RET *pMVar11;
  char *pcVar12;
  long lVar13;
  MppReqV1 mpp_req;
  
  if ((*(int *)((long)ctx + 0x34) < 1) || (*(int *)((long)ctx + 0x30) < *(int *)((long)ctx + 0x34)))
  {
    _mpp_log_l(2,"mpp_serivce","ctx %p invalid request count %d\n","mpp_service_cmd_send",ctx);
    return MPP_ERR_VALUE;
  }
  if (*(int *)((long)ctx + 0x78) != 0) {
    if (*(int *)((long)ctx + 0x188) != 0) {
      mpp_req.cmd = 0x403;
      mpp_req.flag = 2;
      mpp_req.size = *(int *)((long)ctx + 0x78) << 4;
      mpp_req.offset = 0;
      mpp_req.data_ptr = (long)ctx + 0x80;
      RVar6 = mpp_service_ioctl_request(*(RK_S32 *)((long)ctx + 4),&mpp_req);
      if (RVar6 != 0) {
        *(undefined4 *)((long)ctx + 0x188) = 0;
      }
    }
    *(undefined4 *)((long)ctx + 0x78) = 0;
  }
  if (*(int *)((long)ctx + 0x44) != 0) {
    pMVar9 = mpp_service_next_req((MppDevMppService *)ctx);
    pMVar9->cmd = 0x202;
    pMVar9->flag = 0x10;
    iVar3 = *(int *)((long)ctx + 0x44);
    pMVar9->size = iVar3 * 8;
    pMVar9->offset = 0;
    iVar4 = *(int *)((long)ctx + 0x48);
    pMVar9->data_ptr = (long)iVar4 * 8 + *(long *)((long)ctx + 0x38);
    *(int *)((long)ctx + 0x48) = iVar3 + iVar4;
  }
  if (*(int *)((long)ctx + 0x5c) != 0) {
    pMVar9 = mpp_service_next_req((MppDevMppService *)ctx);
    pMVar9->cmd = 0x203;
    pMVar9->flag = 0;
    iVar3 = *(int *)((long)ctx + 0x5c);
    pMVar9->size = iVar3 * 8;
    pMVar9->offset = 0;
    iVar4 = *(int *)((long)ctx + 0x60);
    pMVar9->data_ptr = (long)iVar4 * 8 + *(long *)((long)ctx + 0x50);
    *(int *)((long)ctx + 0x60) = iVar3 + iVar4;
  }
  lVar10 = (long)*(int *)((long)ctx + 0x34);
  if (1 < lVar10) {
    lVar5 = *(long *)((long)ctx + 0x28);
    for (lVar13 = 0; lVar10 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
      pbVar1 = (byte *)(lVar5 + 4 + lVar13);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  pMVar9 = *(MppReqV1 **)((long)ctx + 0x28);
  pRVar2 = &pMVar9[lVar10 + -1].flag;
  *pRVar2 = *pRVar2 | 0x12;
  if (*(int *)((long)ctx + 0x18) == 0) {
    uVar8 = mpp_service_ioctl_request(*(RK_S32 *)((long)ctx + 8),pMVar9);
    if (uVar8 != 0) {
      pMVar11 = __errno_location();
      MVar7 = *pMVar11;
      pcVar12 = strerror(MVar7);
      _mpp_log_l(2,"mpp_serivce","ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                 "mpp_service_cmd_send",(ulong)uVar8,(ulong)(uint)MVar7,pcVar12);
      MVar7 = *pMVar11;
      goto LAB_0017307b;
    }
  }
  else {
    MVar7 = mpp_server_send_task(ctx);
    if (MVar7 != MPP_OK) {
      _mpp_log_l(2,"mpp_serivce","send task to server ret %d\n","mpp_service_cmd_send",
                 (ulong)(uint)MVar7);
      goto LAB_0017307b;
    }
  }
  MVar7 = MPP_OK;
LAB_0017307b:
  *(undefined4 *)((long)ctx + 0x34) = 0;
  *(undefined8 *)((long)ctx + 0x44) = 0;
  *(undefined8 *)((long)ctx + 0x5c) = 0;
  return MVar7;
}

Assistant:

MPP_RET mpp_service_cmd_send(void *ctx)
{
    MPP_RET ret = MPP_OK;
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (p->req_cnt <= 0 || p->req_cnt > p->req_max) {
        mpp_err_f("ctx %p invalid request count %d\n", ctx, p->req_cnt);
        return MPP_ERR_VALUE;
    }

    if (p->info_count) {
        if (p->support_set_info) {
            MppReqV1 mpp_req;

            mpp_req.cmd = MPP_CMD_SEND_CODEC_INFO;
            mpp_req.flag = MPP_FLAGS_LAST_MSG;
            mpp_req.size = p->info_count * sizeof(p->info[0]);
            mpp_req.offset = 0;
            mpp_req.data_ptr = REQ_DATA_PTR(p->info);

            ret = mpp_service_ioctl_request(p->client, &mpp_req);
            if (ret)
                p->support_set_info = 0;
        }
        p->info_count = 0;
    }

    /* set fd trans info if needed */
    if (p->reg_offset_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
        mpp_req->flag = MPP_FLAGS_REG_OFFSET_ALONE;
        mpp_req->size = (p->reg_offset_count) * sizeof(RegOffsetInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->reg_offset_info[p->reg_offset_pos]);
        p->reg_offset_pos += p->reg_offset_count;
    }

    /* set rcb offst info if needed */
    if (p->rcb_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_RCB_INFO;
        mpp_req->flag = 0;
        mpp_req->size = p->rcb_count * sizeof(RcbInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->rcb_info[p->rcb_pos]);
        p->rcb_pos += p->rcb_count;
    }

    /* setup flag for multi message request */
    if (p->req_cnt > 1) {
        RK_S32 i;

        for (i = 0; i < p->req_cnt; i++)
            p->reqs[i].flag |= MPP_FLAGS_MULTI_MSG;
    }
    p->reqs[p->req_cnt - 1].flag |=  MPP_FLAGS_LAST_MSG | MPP_FLAGS_REG_OFFSET_ALONE;

    if (p->batch_io) {
        ret = mpp_server_send_task(ctx);
        if (ret)
            mpp_err_f("send task to server ret %d\n", ret);
    } else {
        ret = mpp_service_ioctl_request(p->server, &p->reqs[0]);
        if (ret) {
            mpp_err_f("ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                      ret, errno, strerror(errno));
            ret = errno;
        }
    }

    p->req_cnt = 0;
    p->reg_offset_count = 0;
    p->reg_offset_pos = 0;
    p->rcb_count = 0;
    p->rcb_pos = 0;
    p->rcb_count = 0;
    return ret;
}